

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_bdecode.cpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_libtorrent::lazy_entry_*>
* __thiscall
libtorrent::lazy_entry::dict_at_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_libtorrent::lazy_entry_*>
           *__return_storage_ptr__,lazy_entry *this,int i)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  lazy_dict_entry *plVar2;
  long lVar3;
  size_type *local_40;
  size_type local_38;
  size_type local_30;
  undefined8 uStack_28;
  
  plVar2 = (this->m_data).dict;
  lVar3 = (long)i;
  local_40 = &local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,plVar2[lVar3 + 1].name,plVar2[lVar3 + 1].val.m_begin);
  paVar1 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
  if (local_40 == &local_30) {
    paVar1->_M_allocated_capacity = local_30;
    *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = uStack_28;
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)local_40;
    (__return_storage_ptr__->first).field_2._M_allocated_capacity = local_30;
  }
  (__return_storage_ptr__->first)._M_string_length = local_38;
  __return_storage_ptr__->second = &plVar2[lVar3 + 1].val;
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, lazy_entry const*> lazy_entry::dict_at(int const i) const
	{
		TORRENT_ASSERT(m_type == dict_t);
		TORRENT_ASSERT(i < int(m_size));
		lazy_dict_entry const& e = m_data.dict[i + 1];
		TORRENT_ASSERT(e.val.m_begin >= e.name);
		return std::make_pair(std::string(e.name, std::size_t(e.val.m_begin - e.name)), &e.val);
	}